

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tradeclient.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  SocketInitiator *this;
  string file;
  SessionSettings settings;
  Application application;
  SessionSettings local_200;
  FileStoreFactory storeFactory;
  ScreenLogFactory logFactory;
  
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar1 = std::operator<<(poVar1,*argv);
    poVar1 = std::operator<<(poVar1," FILE.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,argv[1],(allocator<char> *)&storeFactory);
    FIX::SessionSettings::SessionSettings(&settings,(string *)&file,false);
    Application::Application(&application);
    FIX::FileStoreFactory::FileStoreFactory(&storeFactory,&settings);
    FIX::SessionSettings::SessionSettings(&local_200,&settings);
    FIX::ScreenLogFactory::ScreenLogFactory(&logFactory,&local_200);
    FIX::SessionSettings::~SessionSettings(&local_200);
    this = (SocketInitiator *)operator_new(0x488);
    FIX::SocketInitiator::SocketInitiator
              (this,&application.super_Application,(MessageStoreFactory *)&storeFactory,&settings,
               (LogFactory *)&logFactory);
    FIX::Initiator::start();
    Application::run(&application);
    FIX::Initiator::stop(SUB81(this,0));
    (**(code **)(*(long *)this + 8))(this);
    FIX::ScreenLogFactory::~ScreenLogFactory(&logFactory);
    FIX::FileStoreFactory::~FileStoreFactory(&storeFactory);
    FIX::SessionSettings::~SessionSettings(&settings);
    std::__cxx11::string::~string((string *)&file);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    std::cout << "usage: " << argv[0] << " FILE." << std::endl;
    return 0;
  }
  std::string file = argv[1];

#ifdef HAVE_SSL
  std::string isSSL;
  if (argc > 2) {
    isSSL.assign(argv[2]);
  }
#endif

  try {
    FIX::SessionSettings settings(file);

    Application application;
    FIX::FileStoreFactory storeFactory(settings);
    FIX::ScreenLogFactory logFactory(settings);

    std::unique_ptr<FIX::Initiator> initiator;
#ifdef HAVE_SSL
    if (isSSL.compare("SSL") == 0) {
      initiator = std::unique_ptr<FIX::Initiator>(
          new FIX::ThreadedSSLSocketInitiator(application, storeFactory, settings, logFactory));
    } else if (isSSL.compare("SSL-ST") == 0) {
      initiator = std::unique_ptr<FIX::Initiator>(
          new FIX::SSLSocketInitiator(application, storeFactory, settings, logFactory));
    } else
#endif
      initiator
          = std::unique_ptr<FIX::Initiator>(new FIX::SocketInitiator(application, storeFactory, settings, logFactory));

    initiator->start();
    application.run();
    initiator->stop();

    return 0;
  } catch (std::exception &e) {
    std::cout << e.what();
    return 1;
  }
}